

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

Float __thiscall pbrt::PiecewiseLinearSpectrum::MaxValue(PiecewiseLinearSpectrum *this)

{
  size_t sVar1;
  float *pfVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  
  sVar1 = (this->values).nStored;
  if (sVar1 == 0) {
    return 0.0;
  }
  pfVar5 = (this->values).ptr;
  if (sVar1 != 1) {
    lVar3 = sVar1 * 4 + -4;
    pfVar4 = pfVar5;
    do {
      pfVar4 = pfVar4 + 1;
      pfVar2 = pfVar4;
      if (*pfVar4 <= *pfVar5) {
        pfVar2 = pfVar5;
      }
      pfVar5 = pfVar2;
      lVar3 = lVar3 + -4;
    } while (lVar3 != 0);
  }
  return *pfVar5;
}

Assistant:

PBRT_CPU_GPU
    size_t size() const { return nStored; }